

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::handleRead(EventLoop *this)

{
  LogStream *pLVar1;
  Logger local_ff8;
  ssize_t local_20;
  ssize_t n;
  uint64_t one;
  EventLoop *this_local;
  
  n = 1;
  one = (uint64_t)this;
  local_20 = read(this->wakeupFd_,&n,8);
  if (local_20 != 8) {
    Logger::Logger(&local_ff8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EventLoop.cpp"
                   ,0x76);
    pLVar1 = Logger::stream(&local_ff8);
    pLVar1 = LogStream::operator<<(pLVar1,"Error: EventLoop::handleRead() reads");
    pLVar1 = LogStream::operator<<(pLVar1,local_20);
    LogStream::operator<<(pLVar1," bytes instead of 8");
    Logger::~Logger(&local_ff8);
  }
  return;
}

Assistant:

void EventLoop::handleRead() {
    uint64_t one = 1;
    ssize_t n = read(wakeupFd_, &one, sizeof one);
    if (n != sizeof one) {
        LOG << "Error: EventLoop::handleRead() reads" << n << " bytes instead of 8";
    }
}